

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O0

void __thiscall
chrono::turtlebot::Turtlebot_PassiveWheel::Turtlebot_PassiveWheel
          (Turtlebot_PassiveWheel *this,string *name,bool fixed,
          shared_ptr<chrono::ChMaterialSurface> *mat,ChSystem *system,ChVector<double> *body_pos,
          ChQuaternion<double> *body_rot,shared_ptr<chrono::ChBodyAuxRef> *chassis,bool collide)

{
  ChVector<double> *body_pos_00;
  ChVector<double> *system_00;
  ChColor local_9c;
  ChVector<double> local_90;
  shared_ptr<chrono::ChBodyAuxRef> local_68;
  shared_ptr<chrono::ChMaterialSurface> local_58;
  byte local_41;
  ChVector<double> *pCStack_40;
  bool collide_local;
  ChVector<double> *body_pos_local;
  ChSystem *system_local;
  shared_ptr<chrono::ChMaterialSurface> *mat_local;
  string *psStack_20;
  bool fixed_local;
  string *name_local;
  Turtlebot_PassiveWheel *this_local;
  
  local_41 = collide;
  pCStack_40 = body_pos;
  body_pos_local = (ChVector<double> *)system;
  system_local = (ChSystem *)mat;
  mat_local._7_1_ = fixed;
  psStack_20 = name;
  name_local = (string *)this;
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&local_58,mat);
  system_00 = body_pos_local;
  body_pos_00 = pCStack_40;
  std::shared_ptr<chrono::ChBodyAuxRef>::shared_ptr(&local_68,chassis);
  Turtlebot_Part::Turtlebot_Part
            (&this->super_Turtlebot_Part,name,fixed,&local_58,(ChSystem *)system_00,body_pos_00,
             body_rot,&local_68,(bool)(local_41 & 1));
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr(&local_68);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_58);
  (this->super_Turtlebot_Part)._vptr_Turtlebot_Part =
       (_func_int **)&PTR__Turtlebot_PassiveWheel_002ef3f8;
  std::__cxx11::string::operator=
            ((string *)&(this->super_Turtlebot_Part).m_mesh_name,"passive_wheel");
  ChVector<double>::ChVector(&local_90,0.0,0.0,0.0);
  ChVector<double>::operator=(&(this->super_Turtlebot_Part).m_offset,&local_90);
  ChColor::ChColor(&local_9c,0.4,0.4,0.7);
  ChColor::operator=(&(this->super_Turtlebot_Part).m_color,&local_9c);
  (this->super_Turtlebot_Part).m_density = 200.0;
  return;
}

Assistant:

Turtlebot_PassiveWheel::Turtlebot_PassiveWheel(const std::string& name,
                                               bool fixed,
                                               std::shared_ptr<ChMaterialSurface> mat,
                                               ChSystem* system,
                                               const ChVector<>& body_pos,
                                               const ChQuaternion<>& body_rot,
                                               std::shared_ptr<ChBodyAuxRef> chassis,
                                               bool collide)
    : Turtlebot_Part(name, fixed, mat, system, body_pos, body_rot, chassis, collide) {
    m_mesh_name = "passive_wheel";
    m_offset = ChVector<>(0, 0, 0);
    m_color = ChColor(0.4f, 0.4f, 0.7f);
    m_density = 200;
}